

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O1

int point_mul_g_id_tc26_gost_3410_2012_512_paramSetB
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,BN_CTX *ctx)

{
  ulong uVar1;
  uint64_t *puVar2;
  uint64_t *out1;
  char cVar3;
  int iVar4;
  int iVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  long lVar8;
  byte arg1;
  uint uVar9;
  pt_aff_t_conflict3 (*papVar10) [16];
  pt_aff_t_conflict3 *arg3;
  long lVar11;
  long lVar12;
  bool bVar13;
  uchar b_n [64];
  uchar b_x [64];
  uchar b_y [64];
  pt_aff_t_conflict3 P;
  int8_t rnaf [103];
  byte local_358 [64];
  pt_prj_t_conflict3 local_318;
  pt_prj_t_conflict3 local_258;
  pt_aff_t_conflict3 local_198;
  uint64_t local_118 [8];
  uint64_t local_d8 [8];
  int8_t local_98 [104];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  pBVar7 = BN_CTX_get((BN_CTX *)ctx);
  iVar5 = 0;
  if ((pBVar7 != (BIGNUM *)0x0) && (iVar4 = BN_bn2lebinpad(n,local_358,0x40), iVar4 == 0x40)) {
    local_98[0x50] = '\0';
    local_98[0x51] = '\0';
    local_98[0x52] = '\0';
    local_98[0x53] = '\0';
    local_98[0x54] = '\0';
    local_98[0x55] = '\0';
    local_98[0x56] = '\0';
    local_98[0x57] = '\0';
    local_98[0x58] = '\0';
    local_98[0x59] = '\0';
    local_98[0x5a] = '\0';
    local_98[0x5b] = '\0';
    local_98[0x5c] = '\0';
    local_98[0x5d] = '\0';
    local_98[0x5e] = '\0';
    local_98[0x40] = '\0';
    local_98[0x41] = '\0';
    local_98[0x42] = '\0';
    local_98[0x43] = '\0';
    local_98[0x44] = '\0';
    local_98[0x45] = '\0';
    local_98[0x46] = '\0';
    local_98[0x47] = '\0';
    local_98[0x48] = '\0';
    local_98[0x49] = '\0';
    local_98[0x4a] = '\0';
    local_98[0x4b] = '\0';
    local_98[0x4c] = '\0';
    local_98[0x4d] = '\0';
    local_98[0x4e] = '\0';
    local_98[0x4f] = '\0';
    local_98[0x30] = '\0';
    local_98[0x31] = '\0';
    local_98[0x32] = '\0';
    local_98[0x33] = '\0';
    local_98[0x34] = '\0';
    local_98[0x35] = '\0';
    local_98[0x36] = '\0';
    local_98[0x37] = '\0';
    local_98[0x38] = '\0';
    local_98[0x39] = '\0';
    local_98[0x3a] = '\0';
    local_98[0x3b] = '\0';
    local_98[0x3c] = '\0';
    local_98[0x3d] = '\0';
    local_98[0x3e] = '\0';
    local_98[0x3f] = '\0';
    local_98[0x20] = '\0';
    local_98[0x21] = '\0';
    local_98[0x22] = '\0';
    local_98[0x23] = '\0';
    local_98[0x24] = '\0';
    local_98[0x25] = '\0';
    local_98[0x26] = '\0';
    local_98[0x27] = '\0';
    local_98[0x28] = '\0';
    local_98[0x29] = '\0';
    local_98[0x2a] = '\0';
    local_98[0x2b] = '\0';
    local_98[0x2c] = '\0';
    local_98[0x2d] = '\0';
    local_98[0x2e] = '\0';
    local_98[0x2f] = '\0';
    local_98[0x10] = '\0';
    local_98[0x11] = '\0';
    local_98[0x12] = '\0';
    local_98[0x13] = '\0';
    local_98[0x14] = '\0';
    local_98[0x15] = '\0';
    local_98[0x16] = '\0';
    local_98[0x17] = '\0';
    local_98[0x18] = '\0';
    local_98[0x19] = '\0';
    local_98[0x1a] = '\0';
    local_98[0x1b] = '\0';
    local_98[0x1c] = '\0';
    local_98[0x1d] = '\0';
    local_98[0x1e] = '\0';
    local_98[0x1f] = '\0';
    local_98[0] = '\0';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    local_98[8] = '\0';
    local_98[9] = '\0';
    local_98[10] = '\0';
    local_98[0xb] = '\0';
    local_98[0xc] = '\0';
    local_98[0xd] = '\0';
    local_98[0xe] = '\0';
    local_98[0xf] = '\0';
    local_98[0x5f] = 0;
    local_98[0x60] = '\0';
    local_98[0x61] = '\0';
    local_98[0x62] = '\0';
    local_98[99] = '\0';
    local_98[100] = '\0';
    local_98[0x65] = '\0';
    local_98[0x66] = '\0';
    memset(&local_318,0,0xc0);
    memset(&local_258,0,0xc0);
    puVar2 = local_198.Y;
    local_198.Y[6] = 0;
    local_198.Y[7] = 0;
    local_198.Y[4] = 0;
    local_198.Y[5] = 0;
    local_198.Y[2] = 0;
    local_198.Y[3] = 0;
    local_198.Y[0] = 0;
    local_198.Y[1] = 0;
    local_198.X[6] = 0;
    local_198.X[7] = 0;
    local_198.X[4] = 0;
    local_198.X[5] = 0;
    local_198.X[2] = 0;
    local_198.X[3] = 0;
    local_198.X[0] = 0;
    local_198.X[1] = 0;
    scalar_rwnaf(local_98,local_358);
    local_318.X[6] = 0;
    local_318.X[7] = 0;
    local_318.X[4] = 0;
    local_318.X[5] = 0;
    local_318.X[2] = 0;
    local_318.X[3] = 0;
    local_318.X[0] = 0;
    local_318.X[1] = 0;
    local_318.Y[0] = 0xffffffffffffff91;
    local_318.Y[1] = 0xffffffffffffffff;
    local_318.Y[2] = 0xffffffffffffffff;
    local_318.Y[3] = 0xffffffffffffffff;
    local_318.Y[4] = 0xffffffffffffffff;
    local_318.Y[5] = 0xffffffffffffffff;
    local_318.Y[6] = 0xffffffffffffffff;
    local_318.Y[7] = 0x7fffffffffffffff;
    local_318.Z[0] = 0;
    local_318.Z[1] = 0;
    local_318.Z[2] = 0;
    local_318.Z[3] = 0;
    local_318.Z[4] = 0;
    local_318.Z[5] = 0;
    local_318.Z[6] = 0;
    local_318.Z[7] = 0;
    lVar11 = 7;
    do {
      if (lVar11 != 7) {
        uVar9 = 0;
        do {
          point_double(&local_318,&local_318);
          if (lVar11 == 7) break;
          bVar13 = uVar9 < 4;
          uVar9 = uVar9 + 1;
        } while (bVar13);
      }
      papVar10 = lut_cmb;
      lVar8 = 0;
      do {
        uVar1 = lVar11 + lVar8 * 8;
        if (uVar1 < 0x67) {
          cVar3 = local_98[uVar1];
          lVar12 = 0;
          arg3 = *papVar10;
          do {
            bVar13 = (int)((int)(char)(-1 - (cVar3 >> 7)) + ((int)cVar3 >> 0x1f ^ (int)cVar3) >> 1 ^
                          (uint)lVar12) < 1;
            fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
                      (local_198.X,bVar13,local_198.X,arg3->X);
            fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(puVar2,bVar13,puVar2,arg3->Y);
            lVar12 = lVar12 + 1;
            arg3 = arg3 + 1;
          } while (lVar12 != 0x10);
          fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(local_d8,puVar2);
          fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
                    (puVar2,(byte)(cVar3 >> 7) >> 7,puVar2,local_d8);
          point_add_mixed(&local_318,&local_318,&local_198);
        }
        lVar8 = lVar8 + 1;
        papVar10 = (pt_aff_t_conflict3 (*) [16])((long)papVar10 + 0x800);
      } while (lVar8 != 0xe);
      bVar13 = lVar11 != 0;
      lVar11 = lVar11 + -1;
    } while (bVar13);
    local_198.X[6] = 0xffffffffffffffff;
    local_198.X[7] = 0x7fffffffffffffff;
    local_198.X[4] = 0xffffffffffffffff;
    local_198.X[5] = 0xffffffffffffffff;
    local_198.X[2] = 0xffffffffffffffff;
    local_198.X[3] = 0xffffffffffffffff;
    local_198.X[0] = 0xfffffffffffffeb3;
    local_198.X[1] = 0xffffffffffffffff;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(puVar2,lut_cmb[0][0].Y);
    point_add_mixed(&local_258,&local_318,&local_198);
    arg1 = local_358[0] & 1;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(local_318.X,arg1,local_258.X,local_318.X);
    puVar2 = local_318.Y;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(puVar2,arg1,local_258.Y,puVar2);
    out1 = local_318.Z;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz(out1,arg1,local_258.Z,out1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_inv(out1,out1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(local_118,local_318.X,out1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(local_d8,puVar2,out1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(local_118,local_118);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(local_d8,local_d8);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes((uint8_t *)&local_318,local_118);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes((uint8_t *)&local_258,local_d8);
    iVar5 = CRYPTO_memcmp("",&local_318,0x40);
    if ((iVar5 == 0) && (iVar5 = CRYPTO_memcmp("",&local_258,0x40), iVar5 == 0)) {
      iVar5 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar5 == 0) {
        iVar5 = 0;
        goto LAB_00139afa;
      }
    }
    else {
      lVar11 = BN_lebin2bn(&local_318,0x40,pBVar6);
      iVar5 = 0;
      if ((lVar11 == 0) ||
         ((lVar11 = BN_lebin2bn(&local_258,0x40,pBVar7), iVar5 = 0, lVar11 == 0 ||
          (iVar4 = EC_POINT_set_affine_coordinates(group,r,pBVar6,pBVar7,ctx), iVar4 == 0))))
      goto LAB_00139afa;
    }
    iVar5 = 1;
  }
LAB_00139afa:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar5;
}

Assistant:

int
    point_mul_g_id_tc26_gost_3410_2012_512_paramSetB(const EC_GROUP *group,
                                                     EC_POINT *r,
                                                     const BIGNUM *n,
                                                     BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL || BN_bn2lebinpad(n, b_n, 64) != 64)
        goto err;
    /* do the fixed scalar multiplication */
    point_mul_g(b_x, b_y, b_n);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}